

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O1

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<char>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          char *formula,size_t size,Options<char> *options)

{
  char cVar1;
  Options<char> *options_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  ostream *poVar6;
  size_t sVar7;
  reference pvVar8;
  _Elt_pointer pTVar9;
  runtime_error *prVar10;
  char cVar11;
  undefined4 uVar12;
  long lVar13;
  pointer pTVar14;
  pointer size_00;
  uint uVar15;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *pvVar16;
  ulong uVar17;
  pointer pTVar18;
  pointer pTVar19;
  undefined **ppuVar20;
  char *pcVar21;
  char *__s;
  char *pcVar22;
  bool bVar23;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> sn_regex;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> sn_regex_ss;
  undefined1 local_2c8 [20];
  Subtype SStack_2b4;
  char *pcStack_2b0;
  uint local_2a4;
  pointer local_2a0;
  uint local_294;
  char *local_290;
  uint local_284;
  pointer local_280;
  undefined1 local_278 [32];
  _Elt_pointer local_258;
  _Map_pointer ppTStack_250;
  _Elt_pointer local_248;
  _Elt_pointer pTStack_240;
  _Elt_pointer local_238;
  _Map_pointer ppTStack_230;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *local_220;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  pointer local_200;
  Options<char> *local_1f8;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_1f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1d8;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_2a0 = (pointer)size;
  if ((size < 2) || (*formula != '=')) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Invalid Excel formula","");
    std::runtime_error::runtime_error(prVar10,(string *)local_1b8);
    *(undefined ***)prVar10 = &PTR__runtime_error_0011da50;
    __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20c = 0x7b;
  if ((options->left_brace).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_20c = (uint)(byte)(options->left_brace).super__Optional_base<char,_true,_true>._M_payload.
                            super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_208 = 0x5b;
  if ((options->left_bracket).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_208 = (uint)(byte)(options->left_bracket).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  bVar23 = (options->right_brace).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_engaged != false;
  uVar3 = (uint)(byte)(options->right_brace).super__Optional_base<char,_true,_true>._M_payload.
                      super__Optional_payload_base<char>._M_payload._M_value;
  local_214 = 0x7d;
  if (bVar23) {
    local_214 = uVar3;
  }
  local_204 = 0x5d;
  if (bVar23) {
    local_204 = uVar3;
  }
  local_218 = 0x2c;
  if ((options->list_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_218 = (uint)(byte)(options->list_separator).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  cVar1 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
          super__Optional_payload_base<char>._M_payload._M_value;
  bVar23 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_engaged;
  local_210 = 0x3b;
  if ((options->row_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_210 = (uint)(byte)(options->row_separator).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_290 = formula;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"^[1-9](\\",8);
  cVar11 = '.';
  if (bVar23 != false) {
    cVar11 = cVar1;
  }
  local_278[0] = cVar11;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\d+)?E[+-]\\d*$",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,0x11);
  pcVar22 = local_290;
  size_00 = local_2a0;
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = (_Elt_pointer)0x0;
  ppTStack_230 = (_Map_pointer)0x0;
  local_248 = (_Elt_pointer)0x0;
  pTStack_240 = (_Elt_pointer)0x0;
  local_258 = (_Elt_pointer)0x0;
  ppTStack_250 = (_Map_pointer)0x0;
  local_278._16_8_ = (void *)0x0;
  local_278._24_8_ = 0;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = 0;
  local_220 = __return_storage_ptr__;
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
  _M_initialize_map((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                    local_278,0);
  pTVar19 = (pointer)0x1;
  local_284 = 0;
  uVar17 = 0;
  bVar23 = false;
  pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)0x0;
  pTVar18 = (pointer)0x1;
  local_1f8 = options;
  do {
    cVar1 = pcVar22[(long)pTVar18];
    pTVar14 = pTVar18;
    if (cVar1 == '\0') break;
    pcVar21 = pcVar22 + (long)&pTVar18->m_start;
    uVar3 = (uint)uVar17;
    if (((ulong)pvVar16 & 1) == 0) {
      if (bVar23) {
        if (cVar1 == '\'') {
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar18->m_start)->first
                             + 2);
          if ((pTVar14 <= size_00) && (pcVar21[1] == '\'')) goto LAB_0010565d;
          bVar23 = false;
          pTVar14 = pTVar18;
        }
        goto LAB_00105657;
      }
      if ((uVar17 & 1) != 0) {
        uVar17 = uVar17 & 0xff;
        if (cVar1 == (char)local_204) {
          uVar17 = 0;
        }
        goto LAB_00105657;
      }
      if ((local_284 & 1) == 0) {
        if (pTVar19 < pTVar18) {
          stack0xfffffffffffffd48 = (pointer)0x0;
          pcStack_2b0 = (char *)0x0;
          local_2c8._0_8_ = (pointer)0x0;
          local_2c8._8_8_ = (pointer)0x0;
          local_280 = pTVar18;
          bVar2 = std::__detail::
                  __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (pcVar22 + (long)pTVar19,pcVar21 + 1,
                             (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              *)local_2c8,&local_1d8,0);
          if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2c8._0_8_,(long)stack0xfffffffffffffd48 - local_2c8._0_8_)
            ;
          }
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                    ((ulong)pvVar16 & 0xffffffff);
          size_00 = local_2a0;
          pTVar14 = local_280;
          __return_storage_ptr__ = local_220;
          pcVar22 = local_290;
          if (bVar2) goto LAB_00105657;
        }
        cVar1 = *pcVar21;
        pvVar8 = (reference)0x0;
        uVar15 = (uint)pvVar16;
        if (cVar1 == '\'') {
          if (pTVar19 < pTVar14) {
            local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            local_2c8._0_8_ = pTVar19;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      ((ulong)pvVar16 & 0xffffffff);
            pTVar19 = pTVar14;
          }
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 1);
          bVar23 = true;
        }
        else if (cVar1 == '\"') {
          if (pTVar19 < pTVar14) {
            local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            pvVar16 = __return_storage_ptr__;
            local_2c8._0_8_ = pTVar19;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar19 = pTVar14;
          }
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 1);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                    CONCAT71((int7)((ulong)pvVar16 >> 8),1);
        }
        else if (cVar1 == (char)local_208) {
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 1);
          uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
        }
        else if (cVar1 == '#') {
          if (pTVar19 < pTVar14) {
            local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            local_2c8._0_8_ = pTVar19;
            pvVar8 = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                     emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      ((ulong)pvVar16 & 0xffffffff);
            pTVar19 = pTVar14;
            pcVar22 = local_290;
          }
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 1);
          local_284 = (uint)CONCAT71((int7)((ulong)pvVar8 >> 8),1);
        }
        else if (cVar1 == (char)local_20c) {
          local_294 = uVar3;
          if (pTVar19 < pTVar14) {
            local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            local_2c8._0_8_ = pTVar19;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar19 = pTVar14;
          }
          stack0xfffffffffffffd48 = (pointer)0x100000003;
          local_2c8._0_8_ = pTVar19;
          local_2c8._8_8_ = pTVar14;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          stack0xfffffffffffffd48 = (pointer)0x100000004;
          local_2c8._0_8_ = pTVar19;
          local_2c8._8_8_ = pTVar14;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          local_2c8._0_4_ = 3;
          std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
          emplace_back<xlfparser::Token::Type>
                    ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                     local_278,(Type *)local_2c8);
          local_2c8._0_4_ = 4;
          std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
          emplace_back<xlfparser::Token::Type>
                    ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                     local_278,(Type *)local_2c8);
          uVar3 = local_294;
LAB_001059e1:
          uVar17 = (ulong)uVar3;
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 1);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)(ulong)uVar15;
          size_00 = local_2a0;
          pTVar19 = pTVar14;
        }
        else {
          if ((cVar1 == (char)local_210) && (local_248 != (_Elt_pointer)local_278._16_8_)) {
            pTVar9 = local_248;
            if (local_248 == pTStack_240) {
              pTVar9 = ppTStack_230[-1] + 0x80;
            }
            if (pTVar9[-1] == ArrayRow) {
              if (pTVar19 < pTVar14) {
                local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                stack0xfffffffffffffd48 = (pointer)0x1;
                local_2c8._0_8_ = pTVar19;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                pTVar19 = pTVar14;
              }
              pTVar9 = local_248;
              if (local_248 == pTStack_240) {
                pTVar9 = ppTStack_230[-1] + 0x80;
              }
              stack0xfffffffffffffd48 = (pointer)CONCAT44(Stop,pTVar9[-1]);
              local_2c8._0_8_ = pTVar19;
              local_2c8._8_8_ = pTVar14;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              if (local_248 == pTStack_240) {
                operator_delete(pTStack_240,0x200);
                pTStack_240 = ppTStack_230[-1];
                local_238 = pTStack_240 + 0x80;
                local_248 = pTStack_240 + 0x7f;
                ppTStack_230 = ppTStack_230 + -1;
              }
              else {
                local_248 = local_248 + -1;
              }
              stack0xfffffffffffffd48 = (pointer)0x100000004;
              local_2c8._0_8_ = pTVar19;
              local_2c8._8_8_ = pTVar14;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              local_2c8._0_4_ = 4;
              std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
              emplace_back<xlfparser::Token::Type>
                        ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                         local_278,(Type *)local_2c8);
              goto LAB_001059e1;
            }
          }
          if (cVar1 == (char)local_214) {
            if (pTVar19 < pTVar14) {
              local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
              stack0xfffffffffffffd48 = (pointer)0x1;
              local_2c8._0_8_ = pTVar19;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                        ((ulong)pvVar16 & 0xffffffff);
              pTVar19 = pTVar14;
            }
            if (local_248 == (_Elt_pointer)local_278._16_8_) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_2c8._0_8_ = local_2c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2c8,"Mismatched braces","");
              std::runtime_error::runtime_error(prVar10,(string *)local_2c8);
              *(undefined ***)prVar10 = &PTR__runtime_error_0011da50;
              __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
            }
            pTVar9 = local_248;
            if (local_248 == pTStack_240) {
              pTVar9 = ppTStack_230[-1] + 0x80;
            }
            stack0xfffffffffffffd48 = (pointer)CONCAT44(Stop,pTVar9[-1]);
            local_2c8._0_8_ = pTVar19;
            local_2c8._8_8_ = pTVar14;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            if (local_248 == pTStack_240) {
              operator_delete(pTStack_240,0x200);
              pTStack_240 = ppTStack_230[-1];
              local_238 = pTStack_240 + 0x80;
              local_248 = pTStack_240 + 0x7f;
              ppTStack_230 = ppTStack_230 + -1;
            }
            else {
              local_248 = local_248 + -1;
            }
            pTVar9 = local_248;
            if (local_248 == pTStack_240) {
              pTVar9 = ppTStack_230[-1] + 0x80;
            }
            stack0xfffffffffffffd48 = (pointer)CONCAT44(2,pTVar9[-1]);
            local_2c8._0_8_ = pTVar19;
            local_2c8._8_8_ = pTVar14;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            if (local_248 == pTStack_240) {
              operator_delete(pTStack_240,0x200);
              pTStack_240 = ppTStack_230[-1];
              local_238 = pTStack_240 + 0x80;
              local_248 = pTStack_240 + 0x7f;
              ppTStack_230 = ppTStack_230 + -1;
            }
            else {
              local_248 = local_248 + -1;
            }
LAB_00105dc3:
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      ((ulong)pvVar16 & 0xffffffff);
            pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->
                                       first + 1);
            size_00 = local_2a0;
            pTVar19 = pTVar14;
            goto LAB_0010565d;
          }
          local_2a4 = uVar15;
          if (cVar1 == ' ') {
            local_2c8._0_8_ = pTVar19;
            if (pTVar19 < pTVar14) {
              local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
              stack0xfffffffffffffd48 = (pointer)0x1;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              local_2c8._0_8_ = pTVar14;
            }
            do {
              pTVar19 = pTVar14;
              if (size_00 <= pTVar19) break;
              pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar19->m_start)->
                                         first + 1);
            } while (pcVar22[(long)pTVar19] == ' ');
            local_2c8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0xa;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar14 = pTVar19;
            goto LAB_001056fc;
          }
          pTVar18 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 2);
          if (pTVar18 <= size_00) {
            bVar2 = false;
            ppuVar20 = &PTR_anon_var_dwarf_1c9e9_0011da28;
            __s = ">=";
            local_294 = uVar3;
            local_280 = pTVar19;
            local_200 = pTVar18;
            do {
              sVar7 = strlen(__s);
              if ((sVar7 == 2) && (iVar4 = strncmp(__s,pcVar21,2), iVar4 == 0)) {
                local_2c8._0_8_ = local_280;
                if (local_280 < pTVar14) {
                  local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                  stack0xfffffffffffffd48 = (pointer)0x1;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  local_2c8._0_8_ = pTVar14;
                }
                pcVar22 = local_290;
                size_00 = local_2a0;
                local_2c8._8_8_ =
                     (long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first + 1;
                stack0xfffffffffffffd48 = (pointer)0x500000008;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                pTVar14 = local_200;
                pTVar19 = local_200;
                break;
              }
              __s = *ppuVar20;
              ppuVar20 = ppuVar20 + 1;
              bVar2 = __s == (char *)0x0;
              size_00 = local_2a0;
              pTVar19 = local_280;
              pcVar22 = local_290;
            } while (!bVar2);
            uVar17 = (ulong)local_294;
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      (ulong)local_2a4;
            if (!bVar2) goto LAB_0010565d;
          }
          bVar2 = true;
          if (pcVar22[(long)pTVar14] != '+') {
            lVar13 = 1;
            do {
              cVar1 = "+-*/^&=><@"[lVar13];
              if (lVar13 == 10) {
                bVar2 = cVar1 != '\0';
                goto LAB_00105f9f;
              }
              lVar13 = lVar13 + 1;
            } while (cVar1 != pcVar22[(long)pTVar14]);
            bVar2 = cVar1 != '\0';
          }
          if (pTVar19 < pTVar14) {
            local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x1;
            local_2c8._0_8_ = pTVar19;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar19 = pTVar14;
          }
          stack0xfffffffffffffd48 = (pointer)0x8;
          local_2c8._0_8_ = pTVar19;
          local_2c8._8_8_ = pTVar14;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)(ulong)local_2a4;
LAB_00105f9f:
          if (!bVar2) {
            if (pcVar22[(long)pTVar14] == '%') {
              if (pTVar19 < pTVar14) {
                local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                stack0xfffffffffffffd48 = (pointer)0x1;
                local_2c8._0_8_ = pTVar19;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                pTVar19 = pTVar14;
              }
              stack0xfffffffffffffd48 = (pointer)0x9;
              local_2c8._0_8_ = pTVar19;
              local_2c8._8_8_ = pTVar14;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              bVar2 = true;
              pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                        (ulong)local_2a4;
            }
            uVar15 = (uint)pvVar16;
            if (!bVar2) {
              cVar1 = pcVar22[(long)pTVar14];
              if (cVar1 == '(') {
                if (pTVar19 < pTVar14) {
                  local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                  stack0xfffffffffffffd48 = (pointer)0x100000002;
                  local_2c8._0_8_ = pTVar19;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  local_2c8._0_4_ = 2;
                  std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                  emplace_back<xlfparser::Token::Type>
                            ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                              *)local_278,(Type *)local_2c8);
                }
                else {
                  stack0xfffffffffffffd48 = (pointer)0x100000005;
                  local_2c8._0_8_ = pTVar19;
                  local_2c8._8_8_ = pTVar14;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  local_2c8._0_4_ = 5;
                  std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                  emplace_back<xlfparser::Token::Type>
                            ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                              *)local_278,(Type *)local_2c8);
                }
                goto LAB_00105dc3;
              }
              uVar3 = (uint)uVar17;
              if (cVar1 != (char)local_218) {
                size_00 = local_2a0;
                if (cVar1 != ')') goto LAB_00105657;
                if (pTVar19 < pTVar14) {
                  local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                  stack0xfffffffffffffd48 = (pointer)0x1;
                  local_2c8._0_8_ = pTVar19;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  pTVar19 = pTVar14;
                }
                if (local_248 == (_Elt_pointer)local_278._16_8_) {
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_2c8._0_8_ = local_2c8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2c8,"Mismatched parentheses","");
                  std::runtime_error::runtime_error(prVar10,(string *)local_2c8);
                  *(undefined ***)prVar10 = &PTR__runtime_error_0011da50;
                  __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                pTVar9 = local_248;
                if (local_248 == pTStack_240) {
                  pTVar9 = ppTStack_230[-1] + 0x80;
                }
                stack0xfffffffffffffd48 = (pointer)CONCAT44(2,pTVar9[-1]);
                local_2c8._0_8_ = pTVar19;
                local_2c8._8_8_ = pTVar14;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                if (local_248 == pTStack_240) {
                  operator_delete(pTStack_240,0x200);
                  pTStack_240 = ppTStack_230[-1];
                  local_238 = pTStack_240 + 0x80;
                  local_248 = pTStack_240 + 0x7f;
                  ppTStack_230 = ppTStack_230 + -1;
                }
                else {
                  local_248 = local_248 + -1;
                }
                goto LAB_001059e1;
              }
              local_2c8._0_8_ = pTVar19;
              if (pTVar19 < pTVar14) {
                local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                stack0xfffffffffffffd48 = (pointer)0x1;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                local_2c8._0_8_ = pTVar14;
              }
              if (local_248 == (_Elt_pointer)local_278._16_8_) {
LAB_0010623a:
                uVar5 = 8;
                uVar12 = 0xb;
              }
              else {
                pTVar9 = local_248;
                if (local_248 == pTStack_240) {
                  pTVar9 = ppTStack_230[-1] + 0x80;
                }
                if (pTVar9[-1] != Function) goto LAB_0010623a;
                uVar5 = 6;
                uVar12 = 0;
              }
              stack0xfffffffffffffd48 = (pointer)CONCAT44(uVar12,uVar5);
              local_2c8._8_8_ = pTVar14;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              goto LAB_001059e1;
            }
          }
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first
                             + 1);
          size_00 = local_2a0;
          pTVar19 = pTVar14;
        }
      }
      else {
        pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar18->m_start)->first +
                           1);
        ppuVar20 = &PTR_anon_var_dwarf_1c989_0011d9d8;
        pcVar21 = "#NULL!";
        local_2a4 = (uint)pvVar16;
        local_294 = uVar3;
        local_280 = pTVar18;
        do {
          sVar7 = strlen(pcVar21);
          if ((sVar7 == (long)pTVar14 - (long)pTVar19) &&
             (iVar4 = strncmp(pcVar21,pcVar22 + (long)&pTVar19->m_start,sVar7),
             __return_storage_ptr__ = local_220, iVar4 == 0)) {
            local_2c8._8_8_ = local_280;
            stack0xfffffffffffffd48 = (pointer)0x600000001;
            local_2c8._0_8_ = pTVar19;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(local_220,(Token *)local_2c8);
            local_284 = 0;
            uVar17 = (ulong)local_294;
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      (ulong)local_2a4;
            size_00 = local_2a0;
            pTVar19 = pTVar14;
            pcVar22 = local_290;
            goto LAB_0010565d;
          }
          pcVar21 = *ppuVar20;
          ppuVar20 = ppuVar20 + 1;
        } while (pcVar21 != (char *)0x0);
        uVar17 = (ulong)local_294;
        size_00 = local_2a0;
        __return_storage_ptr__ = local_220;
        pcVar22 = local_290;
LAB_001056fc:
        pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)(ulong)local_2a4;
      }
    }
    else {
      if (cVar1 == '\"') {
        pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar18->m_start)->first +
                           2);
        if ((size_00 < pTVar14) || (pcVar21[1] != '\"')) {
          stack0xfffffffffffffd48 = (pointer)0x300000001;
          local_2c8._0_8_ = pTVar19;
          local_2c8._8_8_ = pTVar18;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar18->m_start)->first
                             + 1);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)0x0;
          pTVar19 = pTVar14;
        }
        goto LAB_0010565d;
      }
LAB_00105657:
      pTVar14 = (pointer)((long)&((pair<const_char_*,_const_char_*> *)&pTVar14->m_start)->first + 1)
      ;
    }
LAB_0010565d:
    pTVar18 = pTVar14;
  } while (pTVar14 < size_00);
  if ((pTVar19 < pTVar14) &&
     ((pTVar18 = (__return_storage_ptr__->
                 super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
      (__return_storage_ptr__->
      super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
      super__Vector_impl_data._M_start == pTVar18 || ((pointer)pTVar18[-1].m_end < pTVar19)))) {
    local_2c8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
    stack0xfffffffffffffd48 = (pointer)0x1;
    local_2c8._0_8_ = pTVar19;
    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::emplace_back<xlfparser::Token>
              (__return_storage_ptr__,(Token *)local_2c8);
  }
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector
            (&local_1f0,__return_storage_ptr__);
  _fix_whitespace_tokens<char>
            ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)local_2c8,&local_1f0,
             pcVar22,(size_t)size_00);
  options_00 = local_1f8;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::_M_move_assign
            (__return_storage_ptr__,local_2c8);
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)stack0xfffffffffffffd48 - local_2c8._0_8_);
  }
  pcVar22 = local_290;
  if (local_1f0.super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _infer_token_subtypes<char>(__return_storage_ptr__,options_00,pcVar22,(size_t)size_00);
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::~_Deque_base
            ((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
             local_278);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }